

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O1

int run_test_udp_connect(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar2;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_loop_t *puVar3;
  long lVar4;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_udp_t *addr;
  sockaddr_in *psVar5;
  uv_buf_t *puVar6;
  char *pcVar7;
  uv_udp_t *loop;
  bool bVar8;
  sockaddr_in ext_addr;
  int addrlen;
  sockaddr_in tmp_addr;
  uv_udp_send_t req;
  undefined1 local_170 [24];
  undefined1 local_158 [16];
  void *local_148;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&lo_addr);
  if (iVar1 == 0) {
    puVar3 = uv_default_loop();
    iVar1 = uv_udp_init(puVar3,&server);
    if (iVar1 != 0) goto LAB_001846e1;
    iVar1 = uv_udp_bind(&server,(sockaddr *)&lo_addr,0);
    if (iVar1 != 0) goto LAB_001846e6;
    iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
    if (iVar1 != 0) goto LAB_001846eb;
    puVar3 = uv_default_loop();
    iVar1 = uv_udp_init(puVar3,&client);
    if (iVar1 != 0) goto LAB_001846f0;
    buf = uv_buf_init("EXIT",4);
    local_148 = (void *)0x0;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)local_158);
    local_170._0_8_ = SEXT48(iVar1);
    if (local_148 != (void *)local_170._0_8_) goto LAB_001846f5;
    iVar1 = uv_udp_connect(&client,(sockaddr *)local_158);
    local_148 = (void *)(long)iVar1;
    local_170._0_8_ = (void *)0x0;
    if (local_148 != (void *)0x0) goto LAB_00184704;
    iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
    local_148 = (void *)(long)iVar1;
    local_170._0_8_ = (void *)0x0;
    if (local_148 != (void *)0x0) goto LAB_00184713;
    pcVar7 = "8.8.8.8";
    addr = (uv_udp_t *)0x23a3;
    iVar1 = uv_ip4_addr("8.8.8.8",0x23a3,(sockaddr_in *)local_170);
    loop = (uv_udp_t *)pcVar7;
    if (iVar1 != 0) goto LAB_00184722;
    loop = (uv_udp_t *)0x1b4e3a;
    addr = (uv_udp_t *)0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&lo_addr);
    if (iVar1 != 0) goto LAB_00184727;
    loop = &client;
    psVar5 = &lo_addr;
    iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
    addr = (uv_udp_t *)psVar5;
    if (iVar1 != 0) goto LAB_0018472c;
    loop = &client;
    addr = (uv_udp_t *)local_170;
    iVar1 = uv_udp_connect(&client,(sockaddr *)addr);
    if (iVar1 != -0x6a) goto LAB_00184731;
    local_170._20_4_ = 0x10;
    loop = &client;
    addr = (uv_udp_t *)local_158;
    iVar1 = uv_udp_getpeername(&client,(sockaddr *)addr,(int *)(local_170 + 0x14));
    if (iVar1 != 0) goto LAB_00184736;
    loop = &client;
    puVar6 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
    addr = (uv_udp_t *)puVar6;
    if (iVar1 != -0x6a) goto LAB_0018473b;
    loop = &client;
    puVar6 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
    addr = (uv_udp_t *)puVar6;
    if (iVar1 != 4) goto LAB_00184740;
    loop = &client;
    puVar6 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)local_170);
    addr = (uv_udp_t *)puVar6;
    if (iVar1 != -0x6a) goto LAB_00184745;
    loop = &client;
    addr = (uv_udp_t *)0x0;
    iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
    if (iVar1 != 0) goto LAB_0018474a;
    loop = &client;
    addr = (uv_udp_t *)0x0;
    iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
    if (iVar1 != -0x6b) goto LAB_0018474f;
    local_170._20_4_ = 0x10;
    loop = &client;
    addr = (uv_udp_t *)local_158;
    iVar1 = uv_udp_getpeername(&client,(sockaddr *)addr,(int *)(local_170 + 0x14));
    if (iVar1 != -0x6b) goto LAB_00184754;
    loop = &client;
    puVar6 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
    addr = (uv_udp_t *)puVar6;
    if (iVar1 != 4) goto LAB_00184759;
    loop = &client;
    puVar6 = &buf;
    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
    addr = (uv_udp_t *)puVar6;
    if (iVar1 != -0x59) goto LAB_0018475e;
    loop = &client;
    psVar5 = &lo_addr;
    iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
    addr = (uv_udp_t *)psVar5;
    if (iVar1 != 0) goto LAB_00184763;
    addr = &client;
    loop = (uv_udp_t *)&stack0xfffffffffffffeb8;
    iVar1 = uv_udp_send((uv_udp_send_t *)loop,&client,&buf,1,(sockaddr *)&lo_addr,cl_send_cb);
    if (iVar1 != -0x6a) goto LAB_00184768;
    addr = &client;
    loop = (uv_udp_t *)&stack0xfffffffffffffeb8;
    iVar1 = uv_udp_send((uv_udp_send_t *)loop,&client,&buf,1,(sockaddr *)0x0,cl_send_cb);
    if (iVar1 != 0) goto LAB_0018476d;
    loop = (uv_udp_t *)uv_default_loop();
    addr = (uv_udp_t *)0x0;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (close_cb_called != 2) goto LAB_00184772;
    if (sv_recv_cb_called != 4) goto LAB_00184777;
    if (cl_send_cb_called != 2) goto LAB_0018477c;
    if (client.send_queue_size != 0) goto LAB_00184781;
    if (server.send_queue_size != 0) goto LAB_00184786;
    puVar3 = uv_default_loop();
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    addr = (uv_udp_t *)0x0;
    uv_run(puVar3,UV_RUN_DEFAULT);
    loop = (uv_udp_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_udp_connect_cold_1();
LAB_001846e1:
    run_test_udp_connect_cold_2();
LAB_001846e6:
    run_test_udp_connect_cold_3();
LAB_001846eb:
    run_test_udp_connect_cold_4();
LAB_001846f0:
    run_test_udp_connect_cold_5();
LAB_001846f5:
    run_test_udp_connect_cold_6();
LAB_00184704:
    run_test_udp_connect_cold_7();
LAB_00184713:
    loop = (uv_udp_t *)&stack0xfffffffffffffeb8;
    addr = (uv_udp_t *)local_170;
    run_test_udp_connect_cold_8();
LAB_00184722:
    run_test_udp_connect_cold_9();
LAB_00184727:
    run_test_udp_connect_cold_10();
LAB_0018472c:
    run_test_udp_connect_cold_11();
LAB_00184731:
    run_test_udp_connect_cold_12();
LAB_00184736:
    run_test_udp_connect_cold_13();
LAB_0018473b:
    run_test_udp_connect_cold_14();
LAB_00184740:
    run_test_udp_connect_cold_15();
LAB_00184745:
    run_test_udp_connect_cold_16();
LAB_0018474a:
    run_test_udp_connect_cold_17();
LAB_0018474f:
    run_test_udp_connect_cold_18();
LAB_00184754:
    run_test_udp_connect_cold_19();
LAB_00184759:
    run_test_udp_connect_cold_20();
LAB_0018475e:
    run_test_udp_connect_cold_21();
LAB_00184763:
    run_test_udp_connect_cold_22();
LAB_00184768:
    run_test_udp_connect_cold_23();
LAB_0018476d:
    run_test_udp_connect_cold_24();
LAB_00184772:
    run_test_udp_connect_cold_25();
LAB_00184777:
    run_test_udp_connect_cold_26();
LAB_0018477c:
    run_test_udp_connect_cold_27();
LAB_00184781:
    run_test_udp_connect_cold_28();
LAB_00184786:
    run_test_udp_connect_cold_29();
  }
  run_test_udp_connect_cold_30();
  lVar4 = CONCAT71(0x5582,loop == &client || loop == &server);
  if (loop == &client || loop == &server) {
    if (addr < (uv_udp_t *)0x10001) {
      *extraout_RDX = alloc_cb::slab;
      extraout_RDX[1] = 0x10000;
      return extraout_EAX;
    }
  }
  else {
    alloc_cb_cold_1();
  }
  alloc_cb_cold_2();
  if ((long)addr < 1) {
    return extraout_EAX_00;
  }
  if (addr == (uv_udp_t *)0x4) {
    if (lVar4 == 0) goto LAB_00184832;
    if (*(int *)*extraout_RDX_00 == 0x54495845) {
      sv_recv_cb_called = sv_recv_cb_called + 1;
      if (sv_recv_cb_called != 4) {
        return sv_recv_cb_called;
      }
      uv_close((uv_handle_t *)&server,close_cb);
      uv_close((uv_handle_t *)&client,close_cb);
      return extraout_EAX_01;
    }
  }
  else {
    sv_recv_cb_cold_1();
LAB_00184832:
    sv_recv_cb_cold_3();
  }
  iVar1 = (int)addr;
  sv_recv_cb_cold_2();
  if ((uv_loop_t *)loop == (uv_loop_t *)0x0) {
    cl_send_cb_cold_5();
LAB_001848fe:
    cl_send_cb_cold_1();
LAB_00184903:
    cl_send_cb_cold_2();
    puVar3 = (uv_loop_t *)loop;
  }
  else {
    if (iVar1 != 0) goto LAB_001848fe;
    if (*(uv_udp_t **)&((uv_loop_t *)loop)->backend_fd != &client &&
        *(uv_udp_t **)&((uv_loop_t *)loop)->backend_fd != &server) goto LAB_00184903;
    iVar1 = cl_send_cb_called + 1;
    bVar8 = cl_send_cb_called != 0;
    iVar2 = cl_send_cb_called;
    cl_send_cb_called = iVar1;
    if (bVar8) {
LAB_001848f1:
      return iVar2;
    }
    uv_udp_connect(&client,(sockaddr *)0x0);
    puVar3 = (uv_loop_t *)loop;
    iVar1 = uv_udp_send((uv_udp_send_t *)loop,&client,&buf,1,(sockaddr *)0x0,cl_send_cb);
    if (iVar1 == -0x59) {
      iVar2 = uv_udp_send((uv_udp_send_t *)loop,&client,&buf,1,(sockaddr *)&lo_addr,cl_send_cb);
      if (iVar2 == 0) goto LAB_001848f1;
      goto LAB_0018490d;
    }
  }
  loop = (uv_udp_t *)puVar3;
  cl_send_cb_cold_3();
LAB_0018490d:
  cl_send_cb_cold_4();
  if (loop == &client || loop == &server) {
    iVar1 = uv_is_closing((uv_handle_t *)loop);
    if (iVar1 != 0) {
      close_cb_called = close_cb_called + 1;
      return extraout_EAX_02;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
    return extraout_EAX_03;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(udp_connect) {
#if defined(__PASE__)
  RETURN_SKIP(
      "IBMi PASE's UDP connection can not be disconnected with AF_UNSPEC.");
#endif
  uv_udp_send_t req;
  struct sockaddr_in ext_addr;
  struct sockaddr_in tmp_addr;
  int r;
  int addrlen;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &lo_addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &lo_addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init("EXIT", 4);

  /* connect() to INADDR_ANY fails on Windows wih WSAEADDRNOTAVAIL */
  ASSERT_EQ(0, uv_ip4_addr("0.0.0.0", TEST_PORT, &tmp_addr));
  r = uv_udp_connect(&client, (const struct sockaddr*) &tmp_addr);
#ifdef _WIN32
  ASSERT_EQ(r, UV_EADDRNOTAVAIL);
#else
  ASSERT_EQ(r, 0);
  r = uv_udp_connect(&client, NULL);
  ASSERT_EQ(r, 0);
#endif

  ASSERT(0 == uv_ip4_addr("8.8.8.8", TEST_PORT, &ext_addr));
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &lo_addr));

  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == 0);

  /* To send messages in connected UDP sockets addr must be NULL */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  r = uv_udp_connect(&client, NULL);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, NULL);
  ASSERT(r == UV_ENOTCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == UV_ENOTCONN);

  /* To send messages in disconnected UDP sockets addr must be set */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == UV_EDESTADDRREQ);


  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &lo_addr,
                  cl_send_cb);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_send(&req, &client, &buf, 1, NULL, cl_send_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);
  ASSERT(sv_recv_cb_called == 4);
  ASSERT(cl_send_cb_called == 2);

  ASSERT(client.send_queue_size == 0);
  ASSERT(server.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}